

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tweakable.cpp
# Opt level: O2

string * Corrade::Utility::Implementation::findTweakableAlias
                   (string *__return_storage_ptr__,string *data)

{
  char cVar1;
  byte bVar2;
  pointer pcVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  StringView prefix;
  size_t local_78;
  string *local_70;
  size_t beg;
  BasicStringView<const_char> local_60 [2];
  BasicStringView<const_char> local_40;
  
  local_70 = __return_storage_ptr__;
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,"CORRADE_TWEAKABLE",(allocator *)local_60);
LAB_0014d093:
  do {
    lVar5 = std::__cxx11::string::find((char *)data,0x15d56d);
    if (lVar5 == -1) {
      return local_70;
    }
    pcVar3 = (data->_M_dataplus)._M_p;
    lVar6 = lVar5;
    do {
      lVar7 = lVar6 + -1;
      if (lVar6 == 0) goto LAB_0014d0e5;
      cVar1 = pcVar3[lVar6 + -1];
      lVar6 = lVar7;
    } while ((cVar1 == ' ') || (cVar1 == '\t'));
  } while (cVar1 != '\n');
LAB_0014d0e5:
  beg = lVar5 + 7U;
  anon_unknown_2::eatWhitespace(data,&beg);
  local_78 = beg;
  do {
    bVar2 = pcVar3[local_78];
    if ((char)bVar2 < 'A') {
      if ((((char)bVar2 < '0') || (0x39 < bVar2)) || (lVar5 + 7U == local_78)) break;
    }
    else if (0x5a < bVar2) {
      if (bVar2 < 0x61) {
        if (bVar2 != 0x5f) break;
      }
      else if (0x7a < bVar2) break;
    }
    local_78 = local_78 + 1;
  } while( true );
  anon_unknown_2::eatWhitespace(data,&local_78);
  Containers::BasicStringView<char_const>::
  BasicStringView<std::__cxx11::string_const&,Corrade::Containers::BasicStringView<char_const>>
            ((BasicStringView<char_const> *)&local_40,data);
  local_60[0] = Containers::BasicStringView<const_char>::exceptPrefix(&local_40,local_78);
  prefix = Containers::Literals::StringLiterals::operator____s("CORRADE_TWEAKABLE",0x11);
  bVar4 = Containers::BasicStringView<const_char>::hasPrefix(local_60,prefix);
  if (bVar4) {
    local_78 = local_78 + local_70->_M_string_length;
    anon_unknown_2::eatWhitespace(data,&local_78);
    if (((data->_M_string_length <= local_78) ||
        (cVar1 = (data->_M_dataplus)._M_p[local_78], cVar1 == '\r')) || (cVar1 == '\n')) {
      std::__cxx11::string::substr((ulong)local_60,(ulong)data);
      std::__cxx11::string::operator=((string *)local_70,(string *)local_60);
      std::__cxx11::string::~string((string *)local_60);
      return local_70;
    }
  }
  goto LAB_0014d093;
}

Assistant:

std::string findTweakableAlias(const std::string& data) {
    using namespace Containers::Literals;

    std::string name = "CORRADE_TWEAKABLE";
    std::size_t pos = 0;
    while((pos = data.find("#define", pos)) != std::string::npos) {
        /* Eat all whitespace before */
        std::size_t prev = pos;
        while(prev && (data[prev - 1] == ' ' || data[prev - 1] == '\t'))
            --prev;

        /* Skip what we found, so `continue`s will not cause an infinite loop */
        pos += 7;

        /* If this is not at the start of a line (or first in the file), nope */
        if(prev && data[prev - 1] != '\n')
            continue;

        /* Get rid of whitespace */
        std::size_t beg = pos;
        eatWhitespace(data, beg);

        /* Consume the name */
        std::size_t end = beg;
        while((data[end] >= 'A' && data[end] <= 'Z') ||
              (data[end] >= 'a' && data[end] <= 'z') ||
              (data[end] >= '0' && data[end] <= '9' && end != pos) ||
              (data[end] == '_')) ++end;

        /* Get rid of whitespace after */
        pos = end;
        eatWhitespace(data, pos);

        /* If the rest doesn't read CORRADE_TWEAKABLE, nope */
        /** @todo convert all this to operate on StringViews when we have
            find() as well */
        if(!Containers::StringView{data}.exceptPrefix(pos).hasPrefix("CORRADE_TWEAKABLE"_s))
            continue;

        /* Get rid of whitespace at the end of the line */
        pos += name.size();
        eatWhitespace(data, pos);

        /* If there is something else than a newline or EOF, nope */
        if(pos < data.size() && data[pos] != '\r' && data[pos] != '\n')
            continue;

        /* Save the name */
        name = data.substr(beg, end - beg);
        break;
    }

    return name;
}